

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[10],unsigned_int,int>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[10],_unsigned_int,_int>
           *__return_storage_ptr__,v10 *this,char (*args) [10],uint *args_1,int *args_2)

{
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  longlong local_b8;
  size_t local_b0;
  int *args_local_2;
  uint *args_local_1;
  char (*args_local) [10];
  size_t local_30;
  
  args_local_2._0_4_ = *(undefined4 *)*args;
  local_b8._0_4_ = *args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_30;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = (char *)args_local_2;
  (__return_storage_ptr__->data_).args_[1].field_0.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v10::appender,_char>_ptr *)
       args_local_1;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_b8;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_b0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}